

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_get_buffer_block_decorations
          (spvc_compiler compiler,spvc_variable_id id,SpvDecoration **decorations,
          size_t *num_decorations)

{
  undefined4 uVar1;
  long lVar2;
  spvc_context psVar3;
  size_t sVar4;
  char *pcVar5;
  uint *puVar6;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var7;
  long lVar8;
  uint32_t i;
  ulong uVar9;
  __node_base _Var10;
  long lVar11;
  Bitset flags;
  SmallVector<unsigned_int,_8UL> local_d8;
  size_t *local_a0;
  SpvDecoration **local_98;
  Bitset local_70;
  
  spirv_cross::Compiler::get_buffer_block_flags
            (&local_70,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,(VariableID)id);
  local_98 = decorations;
  _Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0x40);
  *(undefined8 *)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined ***)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_003a8c00;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  uVar9 = 0;
  do {
    if ((local_70.lower >> (uVar9 & 0x3f) & 1) != 0) {
      spirv_cross::SmallVector<SpvDecoration_,_8UL>::reserve
                ((SmallVector<SpvDecoration_,_8UL> *)
                 ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                 8),*(long *)((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                    _M_head_impl + 0x10) + 1);
      lVar8 = *(long *)((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                              _M_head_impl + 0x10);
      *(int *)(*(long *)((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                               _M_head_impl + 8) + lVar8 * 4) = (int)uVar9;
      *(long *)((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
               0x10) = lVar8 + 1;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x40);
  if (local_70.higher._M_h._M_element_count != 0) {
    local_d8.super_VectorView<unsigned_int>.ptr = (uint *)&local_d8.stack_storage;
    local_d8.super_VectorView<unsigned_int>.buffer_size = 0;
    local_d8.buffer_capacity = 8;
    spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
              (&local_d8,local_70.higher._M_h._M_element_count);
    if (local_70.higher._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var10._M_nxt = local_70.higher._M_h._M_before_begin._M_nxt;
      do {
        spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
                  (&local_d8,local_d8.super_VectorView<unsigned_int>.buffer_size + 1);
        *(undefined4 *)
         ((char *)local_d8.super_VectorView<unsigned_int>.ptr +
         local_d8.super_VectorView<unsigned_int>.buffer_size * 4) =
             *(undefined4 *)&_Var10._M_nxt[1]._M_nxt;
        local_d8.super_VectorView<unsigned_int>.buffer_size =
             local_d8.super_VectorView<unsigned_int>.buffer_size + 1;
        _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
      } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
    }
    puVar6 = local_d8.super_VectorView<unsigned_int>.ptr;
    local_a0 = num_decorations;
    if (local_d8.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar11 = local_d8.super_VectorView<unsigned_int>.buffer_size * 4;
      pcVar5 = (char *)local_d8.super_VectorView<unsigned_int>.ptr;
      lVar8 = 0x3f;
      if (local_d8.super_VectorView<unsigned_int>.buffer_size != 0) {
        for (; local_d8.super_VectorView<unsigned_int>.buffer_size >> lVar8 == 0; lVar8 = lVar8 + -1
            ) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_d8.super_VectorView<unsigned_int>.ptr,pcVar5 + lVar11,
                 ((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,pcVar5 + lVar11);
    }
    puVar6 = local_d8.super_VectorView<unsigned_int>.ptr;
    if (local_d8.super_VectorView<unsigned_int>.buffer_size != 0) {
      lVar11 = local_d8.super_VectorView<unsigned_int>.buffer_size << 2;
      lVar8 = 0;
      do {
        uVar1 = *(undefined4 *)((char *)puVar6 + lVar8);
        spirv_cross::SmallVector<SpvDecoration_,_8UL>::reserve
                  ((SmallVector<SpvDecoration_,_8UL> *)
                   ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl
                   + 8),*(long *)((long)_Var7.
                                        super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                        _M_head_impl + 0x10) + 1);
        lVar2 = *(long *)((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                                _M_head_impl + 0x10);
        *(undefined4 *)
         (*(long *)((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl
                   + 8) + lVar2 * 4) = uVar1;
        *(long *)((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                 0x10) = lVar2 + 1;
        lVar8 = lVar8 + 4;
      } while (lVar11 != lVar8);
    }
    local_d8.super_VectorView<unsigned_int>.buffer_size = 0;
    num_decorations = local_a0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_d8.super_VectorView<unsigned_int>.ptr !=
        &local_d8.stack_storage) {
      free(local_d8.super_VectorView<unsigned_int>.ptr);
      num_decorations = local_a0;
    }
  }
  *local_98 = *(SpvDecoration **)
               ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8
               );
  *num_decorations =
       *(size_t *)
        ((long)_Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10);
  psVar3 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar3->allocations,
            (psVar3->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar4 = (psVar3->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar4]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var7.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar3->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar4 + 1;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70.higher._M_h);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_buffer_block_decorations(spvc_compiler compiler, spvc_variable_id id,
                                                       const SpvDecoration **decorations, size_t *num_decorations)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto flags = compiler->compiler->get_buffer_block_flags(id);
		auto bitset = spvc_allocate<TemporaryBuffer<SpvDecoration>>();

		flags.for_each_bit([&](uint32_t bit) { bitset->buffer.push_back(static_cast<SpvDecoration>(bit)); });

		*decorations = bitset->buffer.data();
		*num_decorations = bitset->buffer.size();
		compiler->context->allocations.push_back(std::move(bitset));
	}